

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

walk_control __thiscall
kainjow::mustache::
component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::walk
          (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,walk_callback *callback)

{
  pointer pcVar1;
  walk_control wVar2;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *child
  ;
  pointer this_00;
  
  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  wVar2 = (*callback->_M_invoker)((_Any_data *)callback,this);
  if (wVar2 != stop) {
    if (wVar2 == skip) {
      wVar2 = walk;
    }
    else {
      pcVar1 = (this->children).
               super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (this->children).
                     super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != pcVar1;
          this_00 = this_00 + 1) {
        wVar2 = walk(this_00,callback);
        if (wVar2 == stop) {
          return stop;
        }
      }
    }
  }
  return wVar2;
}

Assistant:

basic_data(const basic_data& dat) : type_(dat.type_) {
        if (dat.obj_) {
            obj_.reset(new basic_object<string_type>(*dat.obj_));
        } else if (dat.str_) {
            str_.reset(new string_type(*dat.str_));
        } else if (dat.list_) {
            list_.reset(new basic_list<string_type>(*dat.list_));
        } else if (dat.partial_) {
            partial_.reset(new basic_partial<string_type>(*dat.partial_));
        } else if (dat.lambda_) {
            lambda_.reset(new basic_lambda_t<string_type>(*dat.lambda_));
        }
    }